

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

ostream * Fixpp::details::
          FieldWriter<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>>
          ::
          write<Fixpp::Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>>
                    (ostream *os,
                    Field<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                    *field)

{
  void *pvVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
  *instance;
  void *pvVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  uStack_28 = CONCAT17(0x7c,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_28 + 7),1);
  pvVar1 = (field->val_).
           super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>_>
           .
           super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
           .
           super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
           .super_SmallVectorBase.EndX;
  for (pvVar3 = (field->val_).
                super_SmallVectorImpl<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>_>
                .
                super_SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
                .
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
                .super_SmallVectorBase.BeginX; pvVar3 != pvVar1;
      pvVar3 = (void *)((long)pvVar3 + 0x168)) {
    doWriteGroupFields<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<458u,Fixpp::Type::String>,Fixpp::TagT<459u,Fixpp::Type::String>>>,0ul,1ul>
              (os,pvVar3);
  }
  return os;
}

Assistant:

static std::ostream& write(std::ostream& os, const FieldT& field)
        {
            os << GroupTag::Id << "=" << field.size() << SOH;

            static constexpr size_t GroupSize = FieldT::TotalTags;

            const auto& group = field.get();
            for (const auto& instance: group)
            {
                doWriteGroupFields(os, instance, meta::seq::make_index_sequence<GroupSize>{});
            }

            return os;
        }